

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O1

void Wlc_NtkMemBlast_rec(Wlc_Ntk_t *pNew,Wlc_Ntk_t *p,int iObj,Vec_Int_t *vFanins)

{
  Wlc_Obj_t *pWVar1;
  Wlc_Obj_t *pWVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint Entry;
  Vec_Int_t *vFanins_00;
  int *piVar7;
  Vec_Int_t *p_00;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  uint uVar16;
  int iVar17;
  long lVar18;
  
  if ((-1 < iObj) && (iObj < (p->vCopies).nSize)) {
    if ((p->vCopies).pArray[(uint)iObj] != 0) {
      return;
    }
    if ((iObj != 0) && (iObj < p->nObjsAlloc)) {
      pWVar1 = p->pObjs + (uint)iObj;
      uVar16 = pWVar1->nFanins;
      uVar13 = (ulong)uVar16;
      if (0 < (int)uVar16) {
        lVar18 = 0;
        do {
          if ((2 < (uint)uVar13) ||
             (paVar8 = &pWVar1->field_10,
             (undefined1  [24])((undefined1  [24])*pWVar1 & (undefined1  [24])0x2f) ==
             (undefined1  [24])0x6)) {
            paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pWVar1->field_10).pFanins[0];
          }
          Wlc_NtkMemBlast_rec(pNew,p,paVar8->Fanins[lVar18],vFanins);
          lVar18 = lVar18 + 1;
          uVar16 = pWVar1->nFanins;
          uVar13 = (ulong)(int)uVar16;
        } while (lVar18 < (long)uVar13);
      }
      if ((*(ushort *)pWVar1 & 0x3f) == 0x36) {
        p_00 = (Vec_Int_t *)malloc(0x10);
        p_00->nCap = 0x10;
        p_00->nSize = 0;
        piVar7 = (int *)malloc(0x40);
        p_00->pArray = piVar7;
        if ((uVar16 < 3) &&
           ((undefined1  [24])((undefined1  [24])*pWVar1 & (undefined1  [24])0x2f) !=
            (undefined1  [24])0x6)) {
          paVar8 = &pWVar1->field_10;
        }
        else {
          paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pWVar1->field_10).pFanins[0];
        }
        lVar18 = (long)paVar8->Fanins[0];
        if ((0 < lVar18) && (paVar8->Fanins[0] < p->nObjsAlloc)) {
          if ((uVar16 < 3) &&
             ((undefined1  [24])((undefined1  [24])*pWVar1 & (undefined1  [24])0x2f) !=
              (undefined1  [24])0x6)) {
            paVar8 = &pWVar1->field_10;
          }
          else {
            paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pWVar1->field_10).pFanins[0];
          }
          iVar14 = paVar8->Fanins[1];
          lVar10 = (long)iVar14;
          if ((0 < lVar10) && (iVar14 < p->nObjsAlloc)) {
            pWVar2 = p->pObjs;
            iVar5 = pWVar1->End - pWVar1->Beg;
            iVar4 = -iVar5;
            if (0 < iVar5) {
              iVar4 = iVar5;
            }
            iVar17 = pWVar2[lVar10].End - pWVar2[lVar10].Beg;
            iVar5 = -iVar17;
            if (0 < iVar17) {
              iVar5 = iVar17;
            }
            iVar11 = 2 << ((byte)iVar5 & 0x1f);
            iVar9 = pWVar2[lVar18].End - pWVar2[lVar18].Beg;
            iVar17 = -iVar9;
            if (0 < iVar9) {
              iVar17 = iVar9;
            }
            if (iVar4 + 1 << ((byte)iVar5 + 1 & 0x1f) != iVar17 + 1) {
              __assert_fail("nRegs * DataW == Wlc_ObjRange(pMem)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcMem.c"
                            ,0x73,
                            "void Wlc_NtkMemBlast_rec(Wlc_Ntk_t *, Wlc_Ntk_t *, int, Vec_Int_t *)");
            }
            vFanins->nSize = 0;
            if ((iVar14 < 0) || ((p->vCopies).nSize <= iVar14)) goto LAB_0035cc3a;
            Vec_IntPush(vFanins,(p->vCopies).pArray[lVar10]);
            if (0 < iVar11) {
              iVar14 = 0;
              do {
                uVar16 = Wlc_ObjAlloc(pNew,0x16,0,iVar4 + iVar14,iVar14);
                uVar6 = (int)((long)pWVar2 + (lVar18 * 0x18 - (long)p->pObjs) >> 3) * -0x55555555;
                if (((int)uVar6 < 0) || ((p->vCopies).nSize <= (int)uVar6)) goto LAB_0035cc3a;
                iVar5 = (p->vCopies).pArray[uVar6 & 0x7fffffff];
                if (p_00->nCap < 1) {
                  if (p_00->pArray == (int *)0x0) {
                    piVar7 = (int *)malloc(4);
                  }
                  else {
                    piVar7 = (int *)realloc(p_00->pArray,4);
                  }
                  p_00->pArray = piVar7;
                  if (piVar7 == (int *)0x0) goto LAB_0035cc78;
                  p_00->nCap = 1;
                }
                *p_00->pArray = iVar5;
                p_00->nSize = 1;
                Vec_IntPush(p_00,iVar4 + iVar14);
                Vec_IntPush(p_00,iVar14);
                if (((int)uVar16 < 1) || (pNew->nObjsAlloc <= (int)uVar16)) goto LAB_0035cc59;
                Wlc_ObjAddFanins(pNew,pNew->pObjs + uVar16,p_00);
                Vec_IntPush(vFanins,uVar16);
                iVar14 = iVar14 + iVar4 + 1;
                iVar11 = iVar11 + -1;
              } while (iVar11 != 0);
            }
            uVar16 = Wlc_ObjAlloc(pNew,8,0,iVar4,0);
            if ((0 < (int)uVar16) && ((int)uVar16 < pNew->nObjsAlloc)) {
              Wlc_ObjAddFanins(pNew,pNew->pObjs + uVar16,vFanins);
              if ((p->vCopies).nSize <= iObj) {
LAB_0035cc97:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                              ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
              }
              (p->vCopies).pArray[(uint)iObj] = uVar16;
              if (p_00->pArray != (int *)0x0) {
                free(p_00->pArray);
                p_00->pArray = (int *)0x0;
              }
LAB_0035cc27:
              free(p_00);
              return;
            }
          }
        }
      }
      else {
        if ((*(ushort *)pWVar1 & 0x3f) != 0x37) {
          Wlc_ObjDup(pNew,p,iObj,vFanins);
          return;
        }
        vFanins_00 = (Vec_Int_t *)malloc(0x10);
        vFanins_00->nCap = 0x10;
        vFanins_00->nSize = 0;
        piVar7 = (int *)malloc(0x40);
        vFanins_00->pArray = piVar7;
        p_00 = (Vec_Int_t *)malloc(0x10);
        p_00->nCap = 100;
        p_00->nSize = 0;
        piVar7 = (int *)malloc(400);
        p_00->pArray = piVar7;
        if ((uVar16 < 3) &&
           ((undefined1  [24])((undefined1  [24])*pWVar1 & (undefined1  [24])0x2f) !=
            (undefined1  [24])0x6)) {
          paVar8 = &pWVar1->field_10;
        }
        else {
          paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pWVar1->field_10).pFanins[0];
        }
        lVar18 = (long)paVar8->Fanins[0];
        if ((0 < lVar18) && (iVar14 = p->nObjsAlloc, paVar8->Fanins[0] < iVar14)) {
          if ((uVar16 < 3) &&
             ((undefined1  [24])((undefined1  [24])*pWVar1 & (undefined1  [24])0x2f) !=
              (undefined1  [24])0x6)) {
            paVar8 = &pWVar1->field_10;
          }
          else {
            paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pWVar1->field_10).pFanins[0];
          }
          lVar10 = (long)paVar8->Fanins[1];
          if ((0 < lVar10) && (paVar8->Fanins[1] < iVar14)) {
            if ((uVar16 < 3) &&
               ((undefined1  [24])((undefined1  [24])*pWVar1 & (undefined1  [24])0x2f) !=
                (undefined1  [24])0x6)) {
              paVar8 = &pWVar1->field_10;
            }
            else {
              paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pWVar1->field_10).pFanins[0];
            }
            lVar15 = (long)paVar8[1].Fanins[0];
            if ((0 < lVar15) && (paVar8[1].Fanins[0] < iVar14)) {
              pWVar2 = p->pObjs;
              iVar4 = pWVar2[lVar15].End - pWVar2[lVar15].Beg;
              iVar14 = -iVar4;
              if (0 < iVar4) {
                iVar14 = iVar4;
              }
              iVar5 = pWVar2[lVar10].End - pWVar2[lVar10].Beg;
              iVar4 = -iVar5;
              if (0 < iVar5) {
                iVar4 = iVar5;
              }
              uVar16 = 2 << ((byte)iVar4 & 0x1f);
              bVar3 = (byte)iVar4 + 1 & 0x1f;
              iVar17 = iVar14 + 1 << bVar3;
              iVar5 = pWVar2[lVar18].End - pWVar2[lVar18].Beg;
              iVar4 = -iVar5;
              if (0 < iVar5) {
                iVar4 = iVar5;
              }
              if (iVar17 != iVar4 + 1) {
                __assert_fail("nRegs * DataW == Wlc_ObjRange(pMem)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcMem.c"
                              ,0x42,
                              "void Wlc_NtkMemBlast_rec(Wlc_Ntk_t *, Wlc_Ntk_t *, int, Vec_Int_t *)"
                             );
              }
              iVar9 = pWVar1->End - pWVar1->Beg;
              iVar5 = -iVar9;
              if (0 < iVar9) {
                iVar5 = iVar9;
              }
              if (iVar5 != iVar4) {
                __assert_fail("Wlc_ObjRange(pObj) == Wlc_ObjRange(pMem)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcMem.c"
                              ,0x43,
                              "void Wlc_NtkMemBlast_rec(Wlc_Ntk_t *, Wlc_Ntk_t *, int, Vec_Int_t *)"
                             );
              }
              uVar6 = Wlc_ObjAlloc(pNew,0x3a,0,uVar16 - 1,0);
              uVar12 = (int)((long)pWVar2 + (lVar10 * 0x18 - (long)p->pObjs) >> 3) * -0x55555555;
              if (((int)uVar12 < 0) || ((p->vCopies).nSize <= (int)uVar12)) goto LAB_0035cc3a;
              iVar4 = (p->vCopies).pArray[uVar12 & 0x7fffffff];
              if (vFanins_00->nCap < 1) {
                if (vFanins_00->pArray == (int *)0x0) {
                  piVar7 = (int *)malloc(4);
                }
                else {
                  piVar7 = (int *)realloc(vFanins_00->pArray,4);
                }
                vFanins_00->pArray = piVar7;
                if (piVar7 == (int *)0x0) {
LAB_0035cc78:
                  __assert_fail("p->pArray",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                                ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
                }
                vFanins_00->nCap = 1;
              }
              *vFanins_00->pArray = iVar4;
              vFanins_00->nSize = 1;
              if ((0 < (int)uVar6) && ((int)uVar6 < pNew->nObjsAlloc)) {
                Wlc_ObjAddFanins(pNew,pNew->pObjs + uVar6,vFanins_00);
                if (0 < (int)uVar16) {
                  uVar12 = 0 << bVar3;
                  do {
                    Entry = Wlc_ObjAlloc(pNew,0x16,0,uVar12,uVar12);
                    if (vFanins_00->nCap < 1) {
                      if (vFanins_00->pArray == (int *)0x0) {
                        piVar7 = (int *)malloc(4);
                      }
                      else {
                        piVar7 = (int *)realloc(vFanins_00->pArray,4);
                      }
                      vFanins_00->pArray = piVar7;
                      if (piVar7 == (int *)0x0) goto LAB_0035cc78;
                      vFanins_00->nCap = 1;
                    }
                    *vFanins_00->pArray = uVar6;
                    vFanins_00->nSize = 1;
                    Vec_IntPush(vFanins_00,uVar12);
                    Vec_IntPush(vFanins_00,uVar12);
                    if (((int)Entry < 1) || (pNew->nObjsAlloc <= (int)Entry)) goto LAB_0035cc59;
                    Wlc_ObjAddFanins(pNew,pNew->pObjs + Entry,vFanins_00);
                    Vec_IntPush(p_00,Entry);
                    uVar12 = uVar12 + 1;
                  } while (uVar16 != uVar12);
                }
                vFanins->nSize = 0;
                if (0 < (int)uVar16) {
                  iVar4 = 0;
                  uVar13 = (ulong)uVar16;
                  do {
                    uVar6 = Wlc_ObjAlloc(pNew,0x16,0,iVar14 + iVar4,iVar4);
                    uVar12 = (int)((long)pWVar2 + (lVar18 * 0x18 - (long)p->pObjs) >> 3) *
                             -0x55555555;
                    if (((int)uVar12 < 0) || ((p->vCopies).nSize <= (int)uVar12)) goto LAB_0035cc3a;
                    iVar5 = (p->vCopies).pArray[uVar12 & 0x7fffffff];
                    if (vFanins_00->nCap < 1) {
                      if (vFanins_00->pArray == (int *)0x0) {
                        piVar7 = (int *)malloc(4);
                      }
                      else {
                        piVar7 = (int *)realloc(vFanins_00->pArray,4);
                      }
                      vFanins_00->pArray = piVar7;
                      if (piVar7 == (int *)0x0) goto LAB_0035cc78;
                      vFanins_00->nCap = 1;
                    }
                    *vFanins_00->pArray = iVar5;
                    vFanins_00->nSize = 1;
                    Vec_IntPush(vFanins_00,iVar14 + iVar4);
                    Vec_IntPush(vFanins_00,iVar4);
                    if (((int)uVar6 < 1) || (pNew->nObjsAlloc <= (int)uVar6)) goto LAB_0035cc59;
                    Wlc_ObjAddFanins(pNew,pNew->pObjs + uVar6,vFanins_00);
                    Vec_IntPush(vFanins,uVar6);
                    iVar4 = iVar4 + iVar14 + 1;
                    uVar6 = (int)uVar13 - 1;
                    uVar13 = (ulong)uVar6;
                  } while (uVar6 != 0);
                }
                if (0 < (int)uVar16) {
                  uVar13 = 0;
                  do {
                    uVar6 = Wlc_ObjAlloc(pNew,8,0,iVar14,0);
                    if ((long)p_00->nSize <= (long)uVar13) goto LAB_0035cc3a;
                    iVar4 = p_00->pArray[uVar13];
                    if (vFanins_00->nCap < 1) {
                      if (vFanins_00->pArray == (int *)0x0) {
                        piVar7 = (int *)malloc(4);
                      }
                      else {
                        piVar7 = (int *)realloc(vFanins_00->pArray,4);
                      }
                      vFanins_00->pArray = piVar7;
                      if (piVar7 == (int *)0x0) goto LAB_0035cc78;
                      vFanins_00->nCap = 1;
                    }
                    *vFanins_00->pArray = iVar4;
                    vFanins_00->nSize = 1;
                    uVar12 = (int)((long)pWVar2 + (lVar15 * 0x18 - (long)p->pObjs) >> 3) *
                             -0x55555555;
                    if ((((int)uVar12 < 0) || ((p->vCopies).nSize <= (int)uVar12)) ||
                       ((long)vFanins->nSize <= (long)uVar13)) goto LAB_0035cc3a;
                    iVar4 = vFanins->pArray[uVar13];
                    Vec_IntPush(vFanins_00,(p->vCopies).pArray[uVar12 & 0x7fffffff]);
                    Vec_IntPush(vFanins_00,iVar4);
                    if (((int)uVar6 < 1) || (pNew->nObjsAlloc <= (int)uVar6)) goto LAB_0035cc59;
                    Wlc_ObjAddFanins(pNew,pNew->pObjs + uVar6,vFanins_00);
                    if ((long)vFanins->nSize <= (long)uVar13) goto LAB_0035cc97;
                    vFanins->pArray[uVar13] = uVar6;
                    uVar13 = uVar13 + 1;
                  } while (uVar16 != uVar13);
                }
                uVar16 = Wlc_ObjAlloc(pNew,0x17,0,iVar17 + -1,0);
                if ((0 < (int)uVar16) && ((int)uVar16 < pNew->nObjsAlloc)) {
                  Wlc_ObjAddFanins(pNew,pNew->pObjs + uVar16,vFanins);
                  if ((p->vCopies).nSize <= iObj) goto LAB_0035cc97;
                  (p->vCopies).pArray[(uint)iObj] = uVar16;
                  if (vFanins_00->pArray != (int *)0x0) {
                    free(vFanins_00->pArray);
                    vFanins_00->pArray = (int *)0x0;
                  }
                  free(vFanins_00);
                  if (p_00->pArray != (int *)0x0) {
                    free(p_00->pArray);
                    p_00->pArray = (int *)0x0;
                  }
                  goto LAB_0035cc27;
                }
              }
            }
          }
        }
      }
    }
LAB_0035cc59:
    __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlc.h"
                  ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
  }
LAB_0035cc3a:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Memory blasting.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Wlc_NtkMemBlast_rec( Wlc_Ntk_t * pNew, Wlc_Ntk_t * p, int iObj, Vec_Int_t * vFanins )
{
    Wlc_Obj_t * pObj;
    int i, iFanin;
    if ( Wlc_ObjCopy(p, iObj) )
        return;
    pObj = Wlc_NtkObj( p, iObj );
    Wlc_ObjForEachFanin( pObj, iFanin, i )
        Wlc_NtkMemBlast_rec( pNew, p, iFanin, vFanins );
    if ( pObj->Type == WLC_OBJ_WRITE )
    {
        Vec_Int_t * vTemp = Vec_IntAlloc( 1 );
        Vec_Int_t * vBits = Vec_IntAlloc( 100 );
        Wlc_Obj_t * pMem  = Wlc_ObjFanin0(p, pObj);
        Wlc_Obj_t * pAddr = Wlc_ObjFanin1(p, pObj);
        Wlc_Obj_t * pData = Wlc_ObjFanin2(p, pObj);
        int DataW = Wlc_ObjRange(pData);
        int AddrW = Wlc_ObjRange(pAddr);
        int nRegs = 1 << AddrW, iObjNew, iObjDec;
        assert( nRegs * DataW == Wlc_ObjRange(pMem) );
        assert( Wlc_ObjRange(pObj) == Wlc_ObjRange(pMem) );
        // create decoder
        iObjDec = Wlc_ObjAlloc( pNew, WLC_OBJ_DEC, 0, nRegs-1, 0 );
        Vec_IntFill( vTemp, 1, Wlc_ObjCopy(p, Wlc_ObjId(p, pAddr)) );
        Wlc_ObjAddFanins( pNew, Wlc_NtkObj(pNew, iObjDec), vTemp );
        // create decoder bits
        for ( i = 0; i < nRegs; i++ )
        {
            int iObj2 = Wlc_ObjAlloc( pNew, WLC_OBJ_BIT_SELECT, 0, i, i );
            Vec_IntFill( vTemp, 1, iObjDec );
            Vec_IntPushTwo( vTemp, i, i );
            Wlc_ObjAddFanins( pNew, Wlc_NtkObj(pNew, iObj2), vTemp );
            Vec_IntPush( vBits, iObj2 );
        }
        // create data words
        Vec_IntClear( vFanins );
        for ( i = 0; i < nRegs; i++ )
        {
            int iObj2 = Wlc_ObjAlloc( pNew, WLC_OBJ_BIT_SELECT, 0, i*DataW+DataW-1, i*DataW );
            Vec_IntFill( vTemp, 1, Wlc_ObjCopy(p, Wlc_ObjId(p, pMem)) );
            Vec_IntPushTwo( vTemp, i*DataW+DataW-1, i*DataW );
            Wlc_ObjAddFanins( pNew, Wlc_NtkObj(pNew, iObj2), vTemp );
            Vec_IntPush( vFanins, iObj2 );
        }
        // create MUXes of data words controlled by decoder bits
        for ( i = 0; i < nRegs; i++ )
        {
            int iObj2 = Wlc_ObjAlloc( pNew, WLC_OBJ_MUX, 0, DataW-1, 0 );
            Vec_IntFill( vTemp, 1, Vec_IntEntry(vBits, i) );
            Vec_IntPushTwo( vTemp, Wlc_ObjCopy(p, Wlc_ObjId(p, pData)), Vec_IntEntry(vFanins, i) );
            Wlc_ObjAddFanins( pNew, Wlc_NtkObj(pNew, iObj2), vTemp );
            Vec_IntWriteEntry( vFanins, i, iObj2 );
        }
        // concatenate the results
        iObjNew = Wlc_ObjAlloc( pNew, WLC_OBJ_BIT_CONCAT, 0, nRegs*DataW-1, 0 );
        Wlc_ObjAddFanins( pNew, Wlc_NtkObj(pNew, iObjNew), vFanins );
        Wlc_ObjSetCopy( p, iObj, iObjNew );
        Vec_IntFree( vTemp );
        Vec_IntFree( vBits );
    }
    else if ( pObj->Type == WLC_OBJ_READ )
    {
        Vec_Int_t * vTemp = Vec_IntAlloc( 1 );
        Wlc_Obj_t * pMem  = Wlc_ObjFanin0(p, pObj);
        Wlc_Obj_t * pAddr = Wlc_ObjFanin1(p, pObj);
        int DataW = Wlc_ObjRange(pObj);
        int AddrW = Wlc_ObjRange(pAddr);
        int nRegs = 1 << AddrW, iObjNew;
        assert( nRegs * DataW == Wlc_ObjRange(pMem) );
        Vec_IntClear( vFanins );
        Vec_IntPush( vFanins, Wlc_ObjCopy(p, Wlc_ObjId(p, pAddr)) );
        for ( i = 0; i < nRegs; i++ )
        {
            int iObj2 = Wlc_ObjAlloc( pNew, WLC_OBJ_BIT_SELECT, 0, i*DataW+DataW-1, i*DataW );
            Vec_IntFill( vTemp, 1, Wlc_ObjCopy(p, Wlc_ObjId(p, pMem)) );
            Vec_IntPushTwo( vTemp, i*DataW+DataW-1, i*DataW );
            Wlc_ObjAddFanins( pNew, Wlc_NtkObj(pNew, iObj2), vTemp );
            Vec_IntPush( vFanins, iObj2 );
        }
        iObjNew = Wlc_ObjAlloc( pNew, WLC_OBJ_MUX, 0, DataW-1, 0 );
        Wlc_ObjAddFanins( pNew, Wlc_NtkObj(pNew, iObjNew), vFanins );
        Wlc_ObjSetCopy( p, iObj, iObjNew );
        Vec_IntFree( vTemp );
    }
    else
        Wlc_ObjDup( pNew, p, iObj, vFanins );
}